

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_swift.cpp
# Opt level: O1

string * __thiscall
flatbuffers::swift::SwiftGenerator::GenTypeBasic_abi_cxx11_
          (string *__return_storage_ptr__,SwiftGenerator *this,Type *type,bool can_override)

{
  undefined7 in_register_00000009;
  allocator<char> local_9;
  
  if ((int)CONCAT71(in_register_00000009,can_override) != 0) {
    if (type->enum_def != (EnumDef *)0x0) {
      IdlNamer::NamespacedType_abi_cxx11_
                (__return_storage_ptr__,&this->namer_,&type->enum_def->super_Definition);
      return __return_storage_ptr__;
    }
    if (type->base_type == BASE_TYPE_BOOL) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"Bool","");
      return __return_storage_ptr__;
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,GenTypeBasic::swift_type[(int)type->base_type],
             &local_9);
  return __return_storage_ptr__;
}

Assistant:

std::string GenTypeBasic(const Type &type, bool can_override) const {
    // clang-format off
    static const char * const swift_type[] = {
      #define FLATBUFFERS_TD(ENUM, IDLTYPE, \
              CTYPE, JTYPE, GTYPE, NTYPE, PTYPE, RTYPE, KTYPE, STYPE, ...) \
        #STYPE,
        FLATBUFFERS_GEN_TYPES(FLATBUFFERS_TD)
      #undef FLATBUFFERS_TD
    };
    // clang-format on
    if (can_override) {
      if (type.enum_def) return namer_.NamespacedType(*type.enum_def);
      if (type.base_type == BASE_TYPE_BOOL) return "Bool";
    }
    return swift_type[static_cast<int>(type.base_type)];
  }